

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

bool URL::HasInsecureProtocol(char *in,int inlen)

{
  int iVar1;
  int inlen_local;
  char *in_local;
  
  if ((7 < (uint)inlen) && (iVar1 = strncasecmp(in,"http://",7), iVar1 == 0)) {
    return false;
  }
  if ((8 < (uint)inlen) && (iVar1 = strncasecmp(in,"https://",8), iVar1 == 0)) {
    return false;
  }
  if ((6 < (uint)inlen) && (iVar1 = strncasecmp(in,"ftp://",6), iVar1 == 0)) {
    return false;
  }
  return true;
}

Assistant:

bool HasInsecureProtocol(const char* in, int inlen) {
  if (inlen > strliterallen("http://") &&
      strncasecmp(in, "http://", strliterallen("http://")) == 0) {
    return false;  // We're ok, it's an http protocol
  }
  if (inlen > strliterallen("https://") &&
      strncasecmp(in, "https://", strliterallen("https://")) == 0) {
    return false;  // https is ok as well
  }
  if (inlen > strliterallen("ftp://") &&
      strncasecmp(in, "ftp://", strliterallen("ftp://")) == 0) {
    return false;  // and ftp
  }
  return true;
}